

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_float_&,_const_float_&> * __thiscall
Catch::ExprLhs<float_const&>::operator<=
          (BinaryExpr<const_float_&,_const_float_&> *__return_storage_ptr__,
          ExprLhs<float_const&> *this,float *rhs)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  StringRef local_30;
  
  pfVar3 = *(float **)this;
  fVar1 = *rhs;
  fVar2 = *pfVar3;
  StringRef::StringRef(&local_30,"<=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = fVar2 <= fVar1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001d0808;
  __return_storage_ptr__->m_lhs = pfVar3;
  (__return_storage_ptr__->m_op).m_start = local_30.m_start;
  (__return_storage_ptr__->m_op).m_size = local_30.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }